

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O1

void ed_add_pc(ed *out,ed *P,pced *Q)

{
  int i;
  long lVar1;
  fld_t b;
  fld_t a;
  fld_t d;
  fld_t c;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  limb_t local_1a8 [6];
  limb_t local_178 [6];
  long alStack_148 [6];
  limb_t local_118 [6];
  limb_t local_e8 [6];
  limb_t local_b8 [6];
  limb_t local_88 [6];
  limb_t local_58 [6];
  
  lVar1 = 0;
  do {
    local_178[lVar1] = P->y[lVar1] - P->x[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(local_178,local_178,Q->diff);
  lVar1 = 0;
  do {
    local_1a8[lVar1] = P->x[lVar1] + P->y[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(local_1a8,local_1a8,Q->sum);
  fld_mul(local_118,P->t,Q->prod);
  lVar1 = 0;
  do {
    alStack_148[lVar1] = P->z[lVar1] * 2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_58[lVar1] = local_1a8[lVar1] - local_178[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_88[lVar1] = alStack_148[lVar1] - local_118[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_b8[lVar1] = local_118[lVar1] + alStack_148[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    local_e8[lVar1] = local_178[lVar1] + local_1a8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  fld_mul(out->x,local_58,local_88);
  fld_mul(out->y,local_b8,local_e8);
  fld_mul(out->t,local_58,local_e8);
  fld_mul(out->z,local_88,local_b8);
  return;
}

Assistant:

static void
ed_add_pc(struct ed *out, const struct ed *P, const struct pced *Q)
{
	fld_t a, b, c, d, e, f, g, h;

	fld_sub(a, P->y, P->x);
	fld_mul(a, a, Q->diff);

	fld_add(b, P->y, P->x);
	fld_mul(b, b, Q->sum);

	fld_mul(c, P->t, Q->prod);
	fld_scale2(d, P->z);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}